

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O2

void __thiscall
SMBusPacket::CreateFramesForGroupCommand
          (SMBusPacket *this,SMBusAnalyzerResults *pResults,bool has_pec)

{
  pointer pSVar1;
  undefined7 in_register_00000011;
  size_t bcnt;
  ulong uVar2;
  pointer pSVar3;
  pointer pvVar4;
  int iVar5;
  SMBusByte local_58;
  
  for (pvVar4 = (this->chunks).
                super__Vector_base<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar4 != (this->chunks).
                super__Vector_base<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pvVar4 = pvVar4 + 1) {
    SMBusByte::ToAddrFrame
              (&local_58,
               (SMBusProtocol *)
               (pvVar4->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>)._M_impl.
               super__Vector_impl_data._M_start);
    AnalyzerResults::AddFrame((Frame *)pResults);
    Frame::~Frame((Frame *)&local_58);
    SMBusByte::ToPMBusCommandFrame(&local_58);
    AnalyzerResults::AddFrame((Frame *)pResults);
    Frame::~Frame((Frame *)&local_58);
    pSVar3 = (pvVar4->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = 0x40;
    for (uVar2 = 2;
        pSVar1 = (pvVar4->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
        uVar2 < ((long)pSVar1 - (long)pSVar3 >> 5) -
                (CONCAT71(in_register_00000011,has_pec) & 0xffffffff); uVar2 = uVar2 + 1) {
      SMBusByte::ToDataByte(&local_58,(int)pSVar3 + iVar5);
      AnalyzerResults::AddFrame((Frame *)pResults);
      Frame::~Frame((Frame *)&local_58);
      pSVar3 = (pvVar4->super__Vector_base<SMBusByte,_std::allocator<SMBusByte>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar5 = iVar5 + 0x20;
    }
    if (has_pec) {
      SMBusByte::ToPECFrame(&local_58,(char)pSVar1 + 0xe0);
      AnalyzerResults::AddFrame((Frame *)pResults);
      Frame::~Frame((Frame *)&local_58);
    }
  }
  return;
}

Assistant:

void SMBusPacket::CreateFramesForGroupCommand( SMBusAnalyzerResults* pResults, bool has_pec ) const
{
    for( std::vector<std::vector<SMBusByte>>::const_iterator ci( chunks.begin() ); ci != chunks.end(); ++ci )
    {
        const std::vector<SMBusByte>& chunk( *ci );

        U8 pec = 0;

        pResults->AddFrame( chunk.front().ToAddrFrame( NULL ) ); // addr
        pec = SMBusCRCLookup[ pec ^ chunk.front().value ];
        pResults->AddFrame( chunk[ 1 ].ToPMBusCommandFrame() ); // command
        pec = SMBusCRCLookup[ pec ^ chunk[ 1 ].value ];

        for( size_t bcnt = 2; bcnt < chunk.size() - ( has_pec ? 1 : 0 ); ++bcnt )
        {
            pResults->AddFrame( chunk[ bcnt ].ToDataByte() );
            pec = SMBusCRCLookup[ pec ^ chunk[ bcnt ].value ];
        }

        if( has_pec )
            pResults->AddFrame( chunk.back().ToPECFrame( pec ) );
    }
}